

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,char *extension)

{
  bool bVar1;
  int number;
  string local_58 [32];
  char *local_38;
  
  local_38 = extension;
  FilePath(__return_storage_ptr__);
  number = 0;
  do {
    MakeFileName((FilePath *)local_58,directory,base_name,number,local_38);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_58);
    bVar1 = FileOrDirectoryExists(__return_storage_ptr__);
    number = number + 1;
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}